

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.c
# Opt level: O3

void zx_draw(zxspectrum_t *state,zxbox_t *dirty)

{
  pthread_mutex_t *__mutex;
  ulong uVar1;
  zxspectrum_t *pzVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  attribute_t *__dest;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  __mutex = (pthread_mutex_t *)(state[1].screen.pixels + 0x18);
  pthread_mutex_lock(__mutex);
  if (dirty == (zxbox_t *)0x0) {
LAB_0010482b:
    memcpy(state[1].screen.pixels + 0x50,&state->screen,0x1b08);
    pzVar2 = state + 1;
    (pzVar2->screen).pixels[0x40] = '\0';
    (pzVar2->screen).pixels[0x41] = '\0';
    (pzVar2->screen).pixels[0x42] = '\0';
    (pzVar2->screen).pixels[0x43] = 0x80;
    (pzVar2->screen).pixels[0x44] = '\0';
    (pzVar2->screen).pixels[0x45] = '\0';
    (pzVar2->screen).pixels[0x46] = '\0';
    (pzVar2->screen).pixels[0x47] = 0x80;
    pzVar2 = state + 1;
    (pzVar2->screen).pixels[0x48] = 0xff;
    (pzVar2->screen).pixels[0x49] = 0xff;
    (pzVar2->screen).pixels[0x4a] = 0xff;
    (pzVar2->screen).pixels[0x4b] = '\x7f';
    (pzVar2->screen).pixels[0x4c] = 0xff;
    (pzVar2->screen).pixels[0x4d] = 0xff;
    (pzVar2->screen).pixels[0x4e] = 0xff;
    (pzVar2->screen).pixels[0x4f] = '\x7f';
    goto LAB_00104851;
  }
  uVar8 = dirty->x0;
  if ((int)uVar8 < 1) {
    if (((dirty->y0 < 1) && (0xff < dirty->x1)) && (0xbf < dirty->y1)) goto LAB_0010482b;
LAB_001046a8:
    uVar5 = 0;
    if (0 < (int)uVar8) {
      uVar5 = uVar8 >> 3;
    }
  }
  else {
    uVar5 = 0x1f;
    if (uVar8 < 0xff) goto LAB_001046a8;
  }
  iVar6 = dirty->x1;
  iVar3 = 0;
  if (0 < dirty->y0) {
    iVar3 = dirty->y0;
  }
  if (0xbe < iVar3) {
    iVar3 = 0xbf;
  }
  uVar8 = 0x20;
  if (iVar6 < 0x100) {
    uVar8 = 1;
  }
  uVar4 = iVar6 + 7U >> 3;
  if (iVar6 - 0x100U < 0xffffff02) {
    uVar4 = uVar8;
  }
  iVar6 = 1;
  if (1 < dirty->y1) {
    iVar6 = dirty->y1;
  }
  if (0xbf < iVar6) {
    iVar6 = 0xc0;
  }
  uVar8 = 0xc0U - iVar6;
  if (iVar3 < iVar6) {
    do {
      lVar7 = (long)(int)((((uVar8 >> 3 ^ uVar8) & 7) * 9 ^ uVar8) * 0x20 + uVar5);
      memcpy(state[1].screen.pixels + lVar7 + 0x58,(state->screen).pixels + lVar7,
             (long)(int)(uVar4 - uVar5));
      uVar8 = uVar8 + 1;
    } while (uVar8 < -iVar3 + 0xc0U);
  }
  uVar8 = 0xc0U - iVar6 >> 3;
  uVar9 = -iVar3 + 199 >> 3;
  if ((int)uVar8 < (int)uVar9) {
    lVar7 = (ulong)uVar9 - (ulong)uVar8;
    __dest = state[1].screen.attributes + (ulong)(uVar8 << 5) + (ulong)uVar5 + 0x58;
    do {
      memcpy(__dest,__dest + -0x1b88,(long)(int)(uVar4 - uVar5));
      __dest = __dest + 0x20;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  uVar1 = *(ulong *)(state[1].screen.pixels + 0x40);
  uVar11._0_4_ = dirty->x0;
  uVar11._4_4_ = dirty->y0;
  uVar10 = CONCAT44(-(uint)((int)(uVar1 >> 0x20) < (int)uVar11._4_4_),
                    -(uint)((int)uVar1 < (int)(undefined4)uVar11));
  *(ulong *)(state[1].screen.pixels + 0x40) = ~uVar10 & uVar11 | uVar1 & uVar10;
  uVar1 = *(ulong *)(state[1].screen.pixels + 0x48);
  uVar10._0_4_ = dirty->x1;
  uVar10._4_4_ = dirty->y1;
  uVar11 = CONCAT44(-(uint)((int)uVar10._4_4_ < (int)(uVar1 >> 0x20)),
                    -(uint)((int)(undefined4)uVar10 < (int)uVar1));
  *(ulong *)(state[1].screen.pixels + 0x48) = ~uVar11 & uVar10 | uVar1 & uVar11;
LAB_00104851:
  pthread_mutex_unlock(__mutex);
  (*state[1].draw)((zxspectrum_t *)dirty,(zxbox_t *)state[1].out);
  return;
}

Assistant:

static void zx_draw(zxspectrum_t *state, const zxbox_t *dirty)
{
  zxspectrum_private_t *prv = (zxspectrum_private_t *) state;

  mutex_lock(prv->lock);

  /* If no dirty rectangle was specified then assume the full screen. */
  if (dirty == NULL || zxbox_exceeds(dirty, SCREEN_WIDTH, SCREEN_HEIGHT))
  {
    /* Entire screen has been modified - copy it all. */
    memcpy(&prv->screen_copy, &prv->pub.screen, sizeof(prv->screen_copy));

    /* Maximise the overall dirty box that zxspectrum_claim_screen() will
     * use. */
    zxbox_maximise(&prv->dirty);
  }
  else
  {
    /* Copy pub.screen's dirty region into the screen copy. */

    zxbox_t box;
    int     width;
    int     height;
    int     linear_y;

    /* Clamp the dirty rectangle to the screen dimensions. */
    box.x0 = CLAMP(dirty->x0, 0, 255);
    box.y0 = CLAMP(dirty->y0, 0, 191);
    box.x1 = CLAMP(dirty->x1, 1, 256);
    box.y1 = CLAMP(dirty->y1, 1, 192);

    /* Divide down the x coordinates to get byte-sized quantities. */
    box.x0 = (box.x0    ) >> 3; /* divide to 0..31 rounding down */
    box.x1 = (box.x1 + 7) >> 3; /* divide to 0..31 rounding up */

    width = box.x1 - box.x0;

    /* Convert y coordinates into screen space - (0,0) is top left. */
    height = box.y1 - box.y0;
    box.y0 = 192 - box.y1;
    box.y1 = box.y0 + height;

    for (linear_y = box.y0; linear_y < box.y1; linear_y++)
    {
      /* Transpose fields using XOR */
      unsigned int tmp = (linear_y ^ (linear_y >> 3)) & 7;
      int          y   = linear_y ^ (tmp | (tmp << 3));

      memcpy(&prv->screen_copy.pixels[y * 32 + box.x0],
             &prv->pub.screen.pixels[y * 32 + box.x0],
             width);
    }

    /* Divide down the y coordinates to get attribute-sized quantities. */
    box.y0 = (box.y0    ) >> 3;
    box.y1 = (box.y1 + 7) >> 3;

    for (linear_y = box.y0; linear_y < box.y1; linear_y++)
    {
      memcpy(&prv->screen_copy.attributes[linear_y * 32 + box.x0],
             &prv->pub.screen.attributes[linear_y * 32 + box.x0],
             width);
    }

    /* Union the overall dirty box that zxspectrum_claim_screen() will use
     * with the outstanding one. */
    zxbox_union(&prv->dirty, dirty, &prv->dirty);
  }

  mutex_unlock(prv->lock);

  prv->config.draw(dirty, prv->config.opaque);
}